

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O3

void __thiscall
google::protobuf::
Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>::InnerMap
::TransferTree(InnerMap *this,void **table,size_type index)

{
  Tree *tree;
  size_t sVar1;
  _Base_ptr p_Var2;
  iterator iStack_48;
  
  tree = (Tree *)table[index];
  p_Var2 = (tree->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  do {
    sVar1 = internal::TransparentSupport<std::__cxx11::string>::hash::operator()
                      ((hash *)this,
                       *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                        (p_Var2 + 1));
    InsertUnique(&iStack_48,this,
                 (ulong)((int)this->num_buckets_ - 1U &
                        (uint)((sVar1 ^ this->seed_) * -0x61c8864680b583eb >> 0x20)),
                 (Node *)p_Var2[1]._M_parent);
    p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2);
  } while ((_Rb_tree_header *)p_Var2 != &(tree->_M_t)._M_impl.super__Rb_tree_header);
  DestroyTree(this,tree);
  return;
}

Assistant:

void TransferTree(void* const* table, size_type index) {
      Tree* tree = static_cast<Tree*>(table[index]);
      typename Tree::iterator tree_it = tree->begin();
      do {
        InsertUnique(BucketNumber(std::cref(tree_it->first).get()),
                     NodeFromTreeIterator(tree_it));
      } while (++tree_it != tree->end());
      DestroyTree(tree);
    }